

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::parse_expression_list(Parser *this)

{
  ostream *poVar1;
  int iVar2;
  int n_args;
  string local_70;
  string local_50;
  
  poVar1 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t\t\t\t<expression_list>",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  parse_expression(this);
  iVar2 = std::__cxx11::string::compare((char *)&this->cur_token);
  n_args = 1;
  while (iVar2 == 0) {
    poVar1 = (ostream *)this->out_file;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t\t\t\t<symbol>,</symbol>",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    query_tokenizer(this);
    parse_expression(this);
    n_args = n_args + 1;
    iVar2 = std::__cxx11::string::compare((char *)&this->cur_token);
  }
  Symbol_Table::set_temp_arg_count(&this->symbol_table,n_args);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"identifier","");
  check_expected_x_after_y(this,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  poVar1 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t\t\t\t<symbol>)</symbol>",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (ostream *)this->out_file;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t\t\t</expression_list>",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  query_tokenizer(this);
  return;
}

Assistant:

void Parser::parse_expression_list() {
    out_file << "\t\t\t\t\t<expression_list>" << std::endl;
    // for recording arg counts of
    int arg_count = 0;
    parse_expression();
    arg_count++;

    while (cur_token == ",") {
        out_file << "\t\t\t\t\t<symbol>,</symbol>" << std::endl;
        query_tokenizer();

        parse_expression();
        arg_count++;
    }
    symbol_table.set_temp_arg_count(arg_count);
    check_expected_x_after_y(")", "identifier");
    out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
    out_file << "\t\t\t\t</expression_list>" << std::endl;
    query_tokenizer();
}